

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O0

void __thiscall Bob::BlindPermuteProgram(Bob *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Client *this_00;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  ostream *poVar7;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *this_01;
  int local_80;
  int local_7c;
  int j_1;
  int i_1;
  vector<Instruction,_std::allocator<Instruction>_> local_60;
  int local_44;
  int local_40;
  int j;
  int i;
  allocator<Instruction> local_29;
  undefined1 local_28 [8];
  vector<Instruction,_std::allocator<Instruction>_> V;
  Bob *this_local;
  
  iVar1 = (this->super_Party).n_p;
  V.super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<Instruction>::allocator(&local_29);
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_28,(long)iVar1,&local_29);
  std::allocator<Instruction>::~allocator(&local_29);
  for (local_40 = 0; local_40 < (this->super_Party).n_p; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).P,(long)local_40);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_44);
      lVar2 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).R_P,(long)local_40);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_44);
      lVar3 = *pvVar5;
      pvVar6 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                         ((vector<Instruction,_std::allocator<Instruction>_> *)local_28,
                          (long)local_40);
      pvVar6->val[local_44] = lVar2 + lVar3;
    }
  }
  this_00 = this->cli;
  std::vector<Instruction,_std::allocator<Instruction>_>::vector
            (&local_60,(vector<Instruction,_std::allocator<Instruction>_> *)local_28);
  Client::SendProgramVector(this_00,&local_60,(this->super_Party).n_p);
  std::vector<Instruction,_std::allocator<Instruction>_>::~vector(&local_60);
  Client::ReceiveProgramVector((vector<Instruction,_std::allocator<Instruction>_> *)&j_1,this->cli);
  std::vector<Instruction,_std::allocator<Instruction>_>::operator=
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_28,
             (vector<Instruction,_std::allocator<Instruction>_> *)&j_1);
  std::vector<Instruction,_std::allocator<Instruction>_>::~vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)&j_1);
  std::operator<<((ostream *)&std::cout,"Bob\'s Permuted Program P_B:\n");
  for (local_7c = 0; local_7c < (this->super_Party).n_p; local_7c = local_7c + 1) {
    for (local_80 = 0; local_80 < 5; local_80 = local_80 + 1) {
      pvVar6 = std::vector<Instruction,_std::allocator<Instruction>_>::operator[]
                         ((vector<Instruction,_std::allocator<Instruction>_> *)local_28,
                          (long)local_7c);
      lVar2 = pvVar6->val[local_80];
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&this->Pi_P_diff_R_PA_R_PB,(long)local_7c);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_80);
      lVar3 = *pvVar5;
      this_01 = &(this->super_Party).P;
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](this_01,(long)local_7c);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_80);
      *pvVar5 = lVar2 + lVar3;
      pvVar4 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](this_01,(long)local_7c);
      pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_80);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
      std::operator<<(poVar7," ");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::vector<Instruction,_std::allocator<Instruction>_>::~vector
            ((vector<Instruction,_std::allocator<Instruction>_> *)local_28);
  return;
}

Assistant:

void Bob::BlindPermuteProgram()
{
    std::vector<Instruction> V(n_p);
    for(int i=0; i<n_p; i++)
        for(int j=0; j<5; j++)
            V[i].val[j] = P[i][j] + R_P[i][j];
    cli->SendProgramVector(V, n_p);
    V = cli->ReceiveProgramVector();
    std::cout<<"Bob's Permuted Program P_B:\n";
    for(int i=0; i<n_p; i++){
        for(int j=0; j<5; j++){
            P[i][j] = V[i].val[j] + Pi_P_diff_R_PA_R_PB[i][j];
            std::cout<<P[i][j]<<" ";
        }
        std::cout<<std::endl;
    }
}